

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O0

bool __thiscall
LdConfigDirWrapper::wrapSubentriesTable
          (LdConfigDirWrapper *this,size_t parentFieldId,size_t counterFieldId)

{
  int iVar1;
  LdConfigEntryWrapper *this_00;
  undefined4 extraout_var;
  mapped_type *this_01;
  LdConfigEntryWrapper *local_70;
  key_type_conflict2 local_64;
  LdConfigEntryWrapper *local_60 [3];
  LdConfigEntryWrapper *local_48;
  LdConfigEntryWrapper *entry;
  size_t i;
  size_t count;
  size_t sStack_28;
  bool isOk;
  size_t counterFieldId_local;
  size_t parentFieldId_local;
  LdConfigDirWrapper *this_local;
  
  count._7_1_ = 0;
  sStack_28 = counterFieldId;
  counterFieldId_local = parentFieldId;
  parentFieldId_local = (size_t)this;
  i = ExeElementWrapper::getNumValue
                ((ExeElementWrapper *)this,counterFieldId,(bool *)((long)&count + 7));
  if ((count._7_1_ & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    for (entry = (LdConfigEntryWrapper *)0x0; entry < i;
        entry = (LdConfigEntryWrapper *)
                ((long)&(entry->super_ExeNodeWrapper).super_ExeElementWrapper.
                        super_AbstractByteBuffer._vptr_AbstractByteBuffer + 1)) {
      this_00 = (LdConfigEntryWrapper *)operator_new(0x48);
      LdConfigEntryWrapper::LdConfigEntryWrapper
                (this_00,(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                         super_ExeElementWrapper.m_Exe,this,(size_t)entry,counterFieldId_local);
      local_48 = this_00;
      if ((this_00 == (LdConfigEntryWrapper *)0x0) ||
         (iVar1 = (*(this_00->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer
                    ._vptr_AbstractByteBuffer[0xc])(), CONCAT44(extraout_var,iVar1) == 0)) {
        if (local_48 != (LdConfigEntryWrapper *)0x0) {
          (*(local_48->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[1])();
        }
        break;
      }
      local_60[0] = local_48;
      std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::push_back
                (&(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.entries
                 ,(value_type *)local_60);
      local_64 = (key_type_conflict2)counterFieldId_local;
      this_01 = std::
                map<unsigned_int,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>_>_>
                ::operator[](&this->subEntriesMap,&local_64);
      local_70 = local_48;
      std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::push_back
                (this_01,(value_type *)&local_70);
    }
    this_local._7_1_ = (bool)(count._7_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool LdConfigDirWrapper::wrapSubentriesTable(size_t parentFieldId, size_t counterFieldId)
{
    bool isOk = false;
    size_t count = this->getNumValue(counterFieldId, &isOk);
    if (!isOk) {
        return false;
    }
    for (size_t i = 0 ; i < count; i++) {
        LdConfigEntryWrapper *entry = new LdConfigEntryWrapper(m_Exe, this, i, parentFieldId);
        if (!entry || !entry->getPtr()) {
            delete entry;
            break;
        }
        this->entries.push_back(entry);
        this->subEntriesMap[parentFieldId].push_back(entry);
    }
    return isOk;
}